

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O3

int __thiscall QAbstractItemView::sizeHintForRow(QAbstractItemView *this,int row)

{
  QPersistentModelIndex *this_00;
  QAbstractItemViewPrivate *this_01;
  QAbstractItemModel *pQVar1;
  Data *pDVar2;
  QObject *pQVar3;
  long lVar4;
  int iVar5;
  QEditorInfo *pQVar6;
  long *plVar7;
  int extraout_var;
  int iVar8;
  int iVar9;
  long in_FS_OFFSET;
  QStyleOptionViewItem option;
  int local_160;
  QModelIndex local_140;
  undefined1 *local_128;
  undefined1 *puStack_120;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_118;
  QStyleOptionViewItem local_108;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (row < 0) {
    local_160 = -1;
  }
  else {
    this_01 = *(QAbstractItemViewPrivate **)(this + 8);
    pQVar1 = this_01->model;
    this_00 = &this_01->root;
    QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)&local_108,this_00);
    iVar5 = (**(code **)(*(long *)pQVar1 + 0x78))(pQVar1,&local_108);
    local_160 = -1;
    if (row < iVar5) {
      QWidget::ensurePolished((QWidget *)this);
      memset(&local_108,0xaa,0xd0);
      QStyleOptionViewItem::QStyleOptionViewItem(&local_108);
      (**(code **)(*(long *)this + 0x2f8))(this,&local_108);
      pQVar1 = this_01->model;
      QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)&local_128,this_00);
      iVar5 = (**(code **)(*(long *)pQVar1 + 0x80))(pQVar1,(QModelIndex *)&local_128);
      if (iVar5 < 1) {
        local_160 = 0;
      }
      else {
        iVar9 = 0;
        local_160 = 0;
        do {
          local_118.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
          local_128 = &DAT_aaaaaaaaaaaaaaaa;
          puStack_120 = &DAT_aaaaaaaaaaaaaaaa;
          pQVar1 = this_01->model;
          QPersistentModelIndex::operator_cast_to_QModelIndex(&local_140,this_00);
          (**(code **)(*(long *)pQVar1 + 0x60))
                    ((QModelIndex *)&local_128,pQVar1,row,iVar9,&local_140);
          pQVar6 = QAbstractItemViewPrivate::editorForIndex(this_01,(QModelIndex *)&local_128);
          pDVar2 = (pQVar6->widget).wp.d;
          if ((((pDVar2 != (Data *)0x0) && (*(int *)(pDVar2 + 4) != 0)) &&
              (pQVar3 = (pQVar6->widget).wp.value, pQVar3 != (QObject *)0x0)) &&
             (lVar4 = *(long *)(pQVar3 + 0x20),
             iVar8 = (*(int *)(lVar4 + 0x20) - *(int *)(lVar4 + 0x18)) + 1, local_160 <= iVar8)) {
            local_160 = iVar8;
          }
          plVar7 = (long *)(**(code **)(*(long *)this + 0x208))(this,(QModelIndex *)&local_128);
          if ((plVar7 != (long *)0x0) &&
             ((**(code **)(*plVar7 + 0x68))(plVar7,&local_108,(QModelIndex *)&local_128),
             local_160 <= extraout_var)) {
            local_160 = extraout_var;
          }
          iVar9 = iVar9 + 1;
        } while (iVar5 != iVar9);
      }
      QBrush::~QBrush(&local_108.backgroundBrush);
      if (&(local_108.text.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_108.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_108.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
             -1;
        UNLOCK();
        if (((local_108.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
            0) {
          QArrayData::deallocate(&(local_108.text.d.d)->super_QArrayData,2,0x10);
        }
      }
      QIcon::~QIcon(&local_108.icon);
      QLocale::~QLocale(&local_108.locale);
      QFont::~QFont(&local_108.font);
      QStyleOption::~QStyleOption(&local_108.super_QStyleOption);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return local_160;
}

Assistant:

int QAbstractItemView::sizeHintForRow(int row) const
{
    Q_D(const QAbstractItemView);

    if (row < 0 || row >= d->model->rowCount(d->root))
        return -1;

    ensurePolished();

    QStyleOptionViewItem option;
    initViewItemOption(&option);
    int height = 0;
    int colCount = d->model->columnCount(d->root);
    for (int c = 0; c < colCount; ++c) {
        const QModelIndex index = d->model->index(row, c, d->root);
        if (QWidget *editor = d->editorForIndex(index).widget.data())
            height = qMax(height, editor->height());
        if (const QAbstractItemDelegate *delegate = itemDelegateForIndex(index))
            height = qMax(height, delegate->sizeHint(option, index).height());
    }
    return height;
}